

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildElementSlotI1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot regSlot,int32 slotId,
          ProfileId profileId)

{
  undefined1 *puVar1;
  uint uVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  RegSlot reg;
  DWORD DVar9;
  JITTimeFunctionBody *pJVar10;
  StackSym *sym;
  IntConstOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  RegOpnd *src2Opnd;
  FunctionJITTimeInfo *pFVar11;
  ByteCodeUsesInstr *pBVar12;
  PropertySym *pPVar13;
  SymOpnd *pSVar14;
  RegOpnd *pRVar15;
  Instr *pIVar16;
  undefined4 *puVar17;
  Func *pFVar18;
  StackSym *local_50;
  SymID local_3c;
  bool local_31 [8];
  bool isLdSlotThatWasNotProfiled;
  
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  local_3c = JITTimeFunctionBody::GetLocalClosureReg(pJVar10);
  local_31[0] = false;
  local_50 = this->m_func->m_localClosureSym;
  bVar5 = this->m_paramScopeDone;
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  if (bVar5 == true) {
    uVar6 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar10);
  }
  else {
    uVar6 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar10);
  }
  sym = (StackSym *)0x0;
  if (newOpcode < LdEnvObj) {
    if (newOpcode < NewScFunc) {
      if (newOpcode == LdLocalSlot) goto LAB_004d70fd;
      if (newOpcode == StLocalSlot) goto switchD_004d68ee_caseD_145;
    }
    else {
      if (newOpcode - 0xd6 < 2) {
LAB_004d697c:
        src1Opnd = IR::IntConstOpnd::New((long)slotId,TyInt32,this->m_func,true);
        pRVar15 = (RegOpnd *)GetEnvironmentOperand(this,offset);
        dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,false);
        pFVar18 = this->m_func;
        if (sym != (StackSym *)0x0) {
          dstOpnd_00 = IR::RegOpnd::New(TyVar,pFVar18);
          src2Opnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
          pIVar16 = IR::Instr::New(NewScFuncData,&dstOpnd_00->super_Opnd,(Opnd *)pRVar15,
                                   &src2Opnd->super_Opnd,this->m_func);
          AddInstr(this,pIVar16,offset);
          pFVar18 = this->m_func;
          pRVar15 = dstOpnd_00;
        }
        pIVar16 = IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,
                                 &pRVar15->super_Opnd,pFVar18);
        uVar2 = *(uint *)&dstOpnd->m_sym->field_0x18;
        if ((uVar2 & 1) != 0) {
          *(uint *)&dstOpnd->m_sym->field_0x18 = uVar2 | 4;
          puVar1 = &dstOpnd->m_sym->field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 | 2;
        }
        AddInstr(this,pIVar16,offset);
        return;
      }
      if (newOpcode == NewStackScFunc) {
        sym = EnsureStackFuncPtrSym(this);
        newOpcode = NewScFunc;
        goto LAB_004d697c;
      }
    }
switchD_004d68ee_caseD_135:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xf47,"(0)","0");
    if (!bVar5) goto LAB_004d7422;
    *puVar17 = 0;
    pIVar16 = (Instr *)0x0;
    goto LAB_004d73de;
  }
  switch(newOpcode) {
  case LdParamSlot:
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar10);
    local_50 = this->m_func->m_paramClosureSym;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
LAB_004d70fd:
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,uVar7,uVar8);
    if ((uVar6 + 2 <= (uint)slotId) && (!bVar5)) goto LAB_004d7418;
    if ((local_50->field_0x19 & 0x20) != 0) {
      pBVar12 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar12,(local_50->super_Sym).m_id);
      AddInstr(this,&pBVar12->super_Instr,offset);
    }
    if (this->m_func->stackClosure == true) {
      pSVar14 = BuildFieldOpnd(this,LdSlotArr,(local_50->super_Sym).m_id,0,0xffffffff,
                               PropertyKindSlotArray,0xffffffff);
      pRVar15 = IR::RegOpnd::New(TyVar,this->m_func);
      pIVar16 = IR::Instr::New(LdSlotArr,&pRVar15->super_Opnd,&pSVar14->super_Opnd,this->m_func);
      AddInstr(this,pIVar16,offset);
      local_3c = (pRVar15->m_sym->super_Sym).m_id;
      bVar5 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
      if (bVar5) {
        BuildFieldOpnd(this,LdSlotArr,(local_50->super_Sym).m_id,slotId,0xffffffff,
                       PropertyKindSlotArray,0xffffffff);
      }
    }
    else {
      bVar5 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
      if (bVar5) {
        EnsureLoopBodyLoadSlot(this,local_3c,false);
      }
    }
    pPVar13 = PropertySym::FindOrCreate
                        (local_3c,slotId,0xffffffff,0xffffffff,PropertyKindSlots,this->m_func);
    goto LAB_004d735e;
  case ProfiledLdParamSlot:
  case LdInnerObjSlot:
  case ProfiledLdInnerObjSlot:
  case LdObjSlot:
  case ProfiledLdObjSlot:
  case ProfiledLdLocalObjSlot:
  case ProfiledLdParamObjSlot:
  case LdEnvObjSlot:
  case ProfiledLdEnvObjSlot:
  case LdModuleSlot:
  case ProfiledLdModuleSlot:
  case StEnvSlotChkUndecl:
  case StInnerSlotChkUndecl:
  case StObjSlot:
  case StInnerObjSlot:
    goto switchD_004d68ee_caseD_135;
  case LdParamObjSlot:
    local_50 = this->m_func->m_paramClosureSym;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
  case LdLocalObjSlot:
    if ((local_50->field_0x19 & 0x20) != 0) {
      pBVar12 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar12,(local_50->super_Sym).m_id);
      AddInstr(this,&pBVar12->super_Instr,offset);
    }
    DVar9 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pSVar14 = BuildFieldOpnd(this,LdLocalObjSlot,local_3c,DVar9 >> 3,0xffffffff,
                             PropertyKindSlotArray,0xffffffff);
    pRVar15 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar16 = IR::Instr::New(LdSlotArr,&pRVar15->super_Opnd,&pSVar14->super_Opnd,this->m_func);
    AddInstr(this,pIVar16,offset);
    pPVar13 = PropertySym::New(pRVar15->m_sym,slotId,0xffffffff,0xffffffff,PropertyKindSlots,
                               this->m_func);
LAB_004d735e:
    pSVar14 = IR::SymOpnd::New(&pPVar13->super_Sym,TyVar,this->m_func);
    pIVar16 = (Instr *)0x0;
    pRVar15 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    if (profileId != 0xffff) {
      pIVar16 = BuildProfiledSlotLoad(this,LdSlot,pRVar15,pSVar14,profileId,local_31);
    }
    if (pIVar16 == (Instr *)0x0) {
      pIVar16 = IR::Instr::New(LdSlot,&pRVar15->super_Opnd,&pSVar14->super_Opnd,this->m_func);
    }
LAB_004d73d0:
    AddInstr(this,pIVar16,offset);
    break;
  case StParamSlot:
  case StParamSlotChkUndecl:
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetParamScopeSlotArraySize(pJVar10);
    local_50 = this->m_func->m_paramClosureSym;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
    bVar5 = newOpcode == StParamSlot;
    newOpcode = StLocalSlotChkUndecl;
    if (bVar5) {
      newOpcode = StLocalSlot;
    }
  case StLocalSlotChkUndecl:
switchD_004d68ee_caseD_145:
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,uVar7,uVar8);
    if ((uVar6 + 2 <= (uint)slotId) && (!bVar5)) {
LAB_004d7418:
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    if ((local_50->field_0x19 & 0x20) != 0) {
      pBVar12 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar12,(local_50->super_Sym).m_id);
      AddInstr(this,&pBVar12->super_Instr,offset);
    }
    pFVar18 = this->m_func;
    if (pFVar18->stackClosure == true) {
      pRVar15 = IR::RegOpnd::New(TyVar,pFVar18);
      pSVar14 = BuildFieldOpnd(this,LdSlotArr,(local_50->super_Sym).m_id,0,0xffffffff,
                               PropertyKindSlotArray,0xffffffff);
      pIVar16 = IR::Instr::New(LdSlotArr,&pRVar15->super_Opnd,&pSVar14->super_Opnd,this->m_func);
      AddInstr(this,pIVar16,offset);
      local_3c = (pRVar15->m_sym->super_Sym).m_id;
      bVar5 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
      if (bVar5) {
        BuildFieldOpnd(this,LdSlotArr,(local_50->super_Sym).m_id,slotId,0xffffffff,
                       PropertyKindSlotArray,0xffffffff);
      }
    }
    else {
      bVar5 = JITTimeWorkItem::IsLoopBody(pFVar18->m_workItem);
      if (bVar5) {
        EnsureLoopBodyLoadSlot(this,local_3c,false);
      }
    }
    pPVar13 = PropertySym::FindOrCreate
                        (local_3c,slotId,0xffffffff,0xffffffff,PropertyKindSlots,this->m_func);
    pSVar14 = IR::SymOpnd::New(&pPVar13->super_Sym,TyVar,this->m_func);
    pRVar15 = BuildSrcOpnd(this,regSlot,TyVar);
    pIVar16 = IR::Instr::New((newOpcode != StLocalSlot) + StSlot,&pSVar14->super_Opnd,
                             &pRVar15->super_Opnd,this->m_func);
    AddInstr(this,pIVar16,offset);
    if (newOpcode != StLocalSlot) {
      if (pIVar16->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_004d7422;
        *puVar17 = 0;
      }
      pFVar18 = pIVar16->m_func;
      if ((pSVar14->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) {
LAB_004d7422:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar17 = 0;
      }
      bVar4 = (pSVar14->super_Opnd).field_0xb;
      if ((bVar4 & 2) != 0) {
        pSVar14 = (SymOpnd *)IR::Opnd::Copy(&pSVar14->super_Opnd,pFVar18);
        bVar4 = (pSVar14->super_Opnd).field_0xb;
      }
      (pSVar14->super_Opnd).field_0xb = bVar4 | 2;
      pIVar16->m_src2 = &pSVar14->super_Opnd;
    }
    break;
  case StLocalObjSlot:
  case StLocalObjSlotChkUndecl:
    goto switchD_004d68ee_caseD_149;
  case StParamObjSlot:
  case StParamObjSlotChkUndecl:
    local_50 = this->m_func->m_paramClosureSym;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    local_3c = JITTimeFunctionBody::GetParamClosureReg(pJVar10);
    newOpcode = (ushort)(newOpcode != StParamObjSlot) * 2 + StLocalObjSlot;
switchD_004d68ee_caseD_149:
    if ((local_50->field_0x19 & 0x20) != 0) {
      pBVar12 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
      IR::ByteCodeUsesInstr::SetNonOpndSymbol(pBVar12,(local_50->super_Sym).m_id);
      AddInstr(this,&pBVar12->super_Instr,offset);
    }
    pRVar15 = IR::RegOpnd::New(TyVar,this->m_func);
    DVar9 = Js::DynamicObject::GetOffsetOfAuxSlots();
    pSVar14 = BuildFieldOpnd(this,LdSlotArr,local_3c,DVar9 >> 3,0xffffffff,PropertyKindSlotArray,
                             0xffffffff);
    pIVar16 = IR::Instr::New(LdSlotArr,&pRVar15->super_Opnd,&pSVar14->super_Opnd,this->m_func);
    AddInstr(this,pIVar16,offset);
    pPVar13 = PropertySym::New(pRVar15->m_sym,slotId,0xffffffff,0xffffffff,PropertyKindSlots,
                               this->m_func);
    pSVar14 = IR::SymOpnd::New(&pPVar13->super_Sym,TyVar,this->m_func);
    pRVar15 = BuildSrcOpnd(this,regSlot,TyVar);
    pIVar16 = IR::Instr::New((newOpcode != StLocalObjSlot) + StSlot,&pSVar14->super_Opnd,
                             &pRVar15->super_Opnd,this->m_func);
    if (newOpcode != StLocalObjSlot) {
      if (pIVar16->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_004d7422;
        *puVar17 = 0;
      }
      pFVar18 = pIVar16->m_func;
      if ((pSVar14->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) goto LAB_004d7422;
        *puVar17 = 0;
      }
      bVar4 = (pSVar14->super_Opnd).field_0xb;
      if ((bVar4 & 2) != 0) {
        pSVar14 = (SymOpnd *)IR::Opnd::Copy(&pSVar14->super_Opnd,pFVar18);
        bVar4 = (pSVar14->super_Opnd).field_0xb;
      }
      (pSVar14->super_Opnd).field_0xb = bVar4 | 2;
      pIVar16->m_src2 = &pSVar14->super_Opnd;
    }
    goto LAB_004d73d0;
  default:
    if (newOpcode != LdEnvObj) {
      if (newOpcode != LdEnvObj_ReuseLoc) goto switchD_004d68ee_caseD_135;
      sym = (StackSym *)&DAT_00000001;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    reg = JITTimeFunctionBody::GetEnvReg(pJVar10);
    pSVar14 = BuildFieldOpnd(this,LdSlotArr,reg,slotId,0xffffffff,PropertyKindSlotArray,0xffffffff);
    pRVar15 = BuildDstOpnd(this,regSlot,TyVar,false,SUB81(sym,0));
    pIVar16 = IR::Instr::New(LdSlotArr,&pRVar15->super_Opnd,&pSVar14->super_Opnd,this->m_func);
    AddInstr(this,pIVar16,offset);
    Func::AddFrameDisplayCheck(this->m_func->topFunc,pSVar14,0xffffffff);
  }
LAB_004d73de:
  if ((local_31[0] == true) && (bVar5 = DoBailOnNoProfile(this), bVar5)) {
    InsertBailOnNoProfile(this,pIVar16);
    return;
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementSlotI1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot regSlot,
                              int32 slotId, Js::ProfileId profileId)
{
    IR::RegOpnd *regOpnd;
    IR::SymOpnd *fieldOpnd;
    IR::Instr   *instr = nullptr;
    IR::ByteCodeUsesInstr *byteCodeUse;
    PropertySym *fieldSym = nullptr;
    StackSym *   stackFuncPtrSym = nullptr;
    SymID        symID = m_func->GetJITFunctionBody()->GetLocalClosureReg();
    bool isLdSlotThatWasNotProfiled = false;
    bool reuseLoc = false;
    StackSym* closureSym = m_func->GetLocalClosureSym();

    uint scopeSlotSize = this->IsParamScopeDone() ? m_func->GetJITFunctionBody()->GetScopeSlotArraySize() : m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();

    switch (newOpcode)
    {
        case Js::OpCode::LdParamSlot:
            scopeSlotSize = m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            // Fall through

        case Js::OpCode::LdLocalSlot:
            if (!PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
            {
                if ((uint32)slotId >= scopeSlotSize + Js::ScopeSlots::FirstSlotIndex)
                {
                    Js::Throw::FatalInternalError();
                }
            }

            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            // Read the scope slot pointer back using the stack closure sym.
            newOpcode = Js::OpCode::LdSlot;
            if (m_func->DoStackFrameDisplay())
            {
                // Read the scope slot pointer back using the stack closure sym.
                fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);

                regOpnd = IR::RegOpnd::New(TyVar, m_func);
                instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
                this->AddInstr(instr, offset);
                symID = regOpnd->m_sym->m_id;

                if (IsLoopBody())
                {
                    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
                }
            }
            else if (IsLoopBody())
            {
                this->EnsureLoopBodyLoadSlot(symID);
            }

            fieldSym = PropertySym::FindOrCreate(symID, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildDstOpnd(regSlot);
            instr = nullptr;
            if (profileId != Js::Constants::NoProfileId)
            {
                instr = this->BuildProfiledSlotLoad(Js::OpCode::LdSlot, regOpnd, fieldOpnd, profileId, &isLdSlotThatWasNotProfiled);
            }
            if (!instr)
            {
                instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, fieldOpnd, m_func);
            }
            this->AddInstr(instr, offset);

            break;

        case Js::OpCode::LdParamObjSlot:
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = Js::OpCode::LdLocalObjSlot;
            // Fall through

        case Js::OpCode::LdLocalObjSlot:
            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            fieldOpnd = this->BuildFieldOpnd(newOpcode, symID, (Js::DynamicObject::GetOffsetOfAuxSlots()) / sizeof(Js::Var), (Js::PropertyIdIndexType) - 1, PropertyKindSlotArray);
            regOpnd = IR::RegOpnd::New(TyVar, m_func);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

            regOpnd = this->BuildDstOpnd(regSlot);
            instr = nullptr;
            newOpcode = Js::OpCode::LdSlot;
            if (profileId != Js::Constants::NoProfileId)
            {
                instr = this->BuildProfiledSlotLoad(newOpcode, regOpnd, fieldOpnd, profileId, &isLdSlotThatWasNotProfiled);
            }
            if (!instr)
            {
                instr = IR::Instr::New(newOpcode, regOpnd, fieldOpnd, m_func);
            }
            this->AddInstr(instr, offset);
            break;

        case Js::OpCode::StParamSlot:
        case Js::OpCode::StParamSlotChkUndecl:
            scopeSlotSize = m_func->GetJITFunctionBody()->GetParamScopeSlotArraySize();
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = newOpcode == Js::OpCode::StParamSlot ? Js::OpCode::StLocalSlot : Js::OpCode::StLocalSlotChkUndecl;
            // Fall through

        case Js::OpCode::StLocalSlot:
        case Js::OpCode::StLocalSlotChkUndecl:
            if (!PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
            {
                if ((uint32)slotId >= scopeSlotSize + Js::ScopeSlots::FirstSlotIndex)
                {
                    Js::Throw::FatalInternalError();
                }
            }

            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            newOpcode = newOpcode == Js::OpCode::StLocalSlot ? Js::OpCode::StSlot : Js::OpCode::StSlotChkUndecl;
            if (m_func->DoStackFrameDisplay())
            {
                regOpnd = IR::RegOpnd::New(TyVar, m_func);
                // Read the scope slot pointer back using the stack closure sym.
                fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);

                instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
                this->AddInstr(instr, offset);
                symID = regOpnd->m_sym->m_id;

                if (IsLoopBody())
                {
                    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, closureSym->m_id, slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
                }
            }
            else
            {
                if (IsLoopBody())
                {
                    this->EnsureLoopBodyLoadSlot(symID);
                }
            }
            fieldSym = PropertySym::FindOrCreate(symID, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildSrcOpnd(regSlot);
            instr = IR::Instr::New(newOpcode, fieldOpnd, regOpnd, m_func);
            this->AddInstr(instr, offset);
            if (newOpcode == Js::OpCode::StSlotChkUndecl)
            {
                instr->SetSrc2(fieldOpnd);
            }

            break;

        case Js::OpCode::StParamObjSlot:
        case Js::OpCode::StParamObjSlotChkUndecl:
            closureSym = m_func->GetParamClosureSym();
            symID = m_func->GetJITFunctionBody()->GetParamClosureReg();
            newOpcode = newOpcode == Js::OpCode::StParamObjSlot ? Js::OpCode::StLocalObjSlot : Js::OpCode::StLocalObjSlotChkUndecl;
            // Fall through

        case Js::OpCode::StLocalObjSlot:
        case Js::OpCode::StLocalObjSlotChkUndecl:
            if (closureSym->HasByteCodeRegSlot())
            {
                byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(closureSym->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            regOpnd = IR::RegOpnd::New(TyVar, m_func);
            fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, symID, (Js::DynamicObject::GetOffsetOfAuxSlots())/sizeof(Js::Var), (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            newOpcode = newOpcode == Js::OpCode::StLocalObjSlot ? Js::OpCode::StSlot : Js::OpCode::StSlotChkUndecl;
            fieldSym = PropertySym::New(regOpnd->m_sym, slotId, (uint32)-1, (uint)-1, PropertyKindSlots, m_func);
            fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);
            regOpnd = this->BuildSrcOpnd(regSlot);

            instr = IR::Instr::New(newOpcode, fieldOpnd, regOpnd, m_func);
            if (newOpcode == Js::OpCode::StSlotChkUndecl)
            {
                // ChkUndecl includes an implicit read of the destination. Communicate the liveness by using the destination in src2.
                instr->SetSrc2(fieldOpnd);
            }
            this->AddInstr(instr, offset);
            break;

        case Js::OpCode::LdEnvObj_ReuseLoc:
            reuseLoc = true;
            // fall through
        case Js::OpCode::LdEnvObj:
            fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, this->GetEnvReg(), slotId, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
            regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);
            instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
            this->AddInstr(instr, offset);

            m_func->GetTopFunc()->AddFrameDisplayCheck(fieldOpnd);
            break;

        case Js::OpCode::NewStackScFunc:
            stackFuncPtrSym = this->EnsureStackFuncPtrSym();
            newOpcode = Js::OpCode::NewScFunc;
            // fall through
        case Js::OpCode::NewScFunc:
            goto NewScFuncCommon;

        case Js::OpCode::NewScGenFunc:
            newOpcode = Js::OpCode::NewScGenFunc;
NewScFuncCommon:
            {
                IR::Opnd * functionBodySlotOpnd = IR::IntConstOpnd::New(slotId, TyInt32, m_func, true);

                IR::Opnd *environmentOpnd = GetEnvironmentOperand(offset);
                regOpnd = this->BuildDstOpnd(regSlot);
                if (stackFuncPtrSym)
                {
                    IR::RegOpnd * dataOpnd = IR::RegOpnd::New(TyVar, m_func);
                    instr = IR::Instr::New(Js::OpCode::NewScFuncData, dataOpnd, environmentOpnd, 
                                           IR::RegOpnd::New(stackFuncPtrSym, TyVar, m_func), m_func);
                    this->AddInstr(instr, offset);
                    instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, dataOpnd, m_func);
                }
                else
                {
                    instr = IR::Instr::New(newOpcode, regOpnd, functionBodySlotOpnd, environmentOpnd, m_func);
                }
                if (regOpnd->m_sym->m_isSingleDef)
                {
                    regOpnd->m_sym->m_isSafeThis = true;
                    regOpnd->m_sym->m_isNotNumber = true;
                }
                this->AddInstr(instr, offset);
                return;
            }

        default:
            Assert(0);
    }


    if(isLdSlotThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}